

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>>
          (Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Field_element *val,
          set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
          *column)

{
  int iVar1;
  Zp_field_operators<unsigned_int,_void> *this_00;
  New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
  *pNVar2;
  value_type pEVar3;
  Element EVar4;
  bool bVar5;
  Element EVar6;
  size_type __new_size;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar7;
  reference ppEVar8;
  reference ppEVar9;
  uint *puVar10;
  iterator iVar11;
  iterator iVar12;
  size_type sVar13;
  ID_index local_a4;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_a0;
  reference local_98;
  Entry *entry_2;
  iterator __end0_2;
  iterator __begin0_2;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  *__range3_1;
  Entry *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  Column_support *__range3;
  Field_element pivotVal;
  Entry *entry;
  iterator __end0;
  iterator __begin0;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  *__range4;
  Index i;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  *column_local;
  Field_element *val_local;
  Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *this_local;
  
  if (*val == 0) {
    Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
    ::clear((Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             *)this);
  }
  bVar5 = std::
          vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
          ::empty((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   *)(this + 8));
  if (bVar5) {
    __new_size = std::
                 set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
                 ::size(column);
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              *)(this + 8),__new_size);
    __range4._4_4_ = 0;
    __end0 = std::
             set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
             ::begin(column);
    entry = (Entry *)std::
                     set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
                     ::end(column);
    while( true ) {
      bVar5 = std::operator!=(&__end0,(_Self *)&entry);
      if (!bVar5) break;
      _pivotVal = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                  ::operator*(&__end0);
      pNVar2 = *(New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                 **)(this + 0x30);
      __range3._4_4_ =
           Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
           ::get_row_index(_pivotVal);
      pEVar7 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
               ::construct<unsigned_int>(pNVar2,(uint *)((long)&__range3 + 4));
      ppEVar9 = std::
                vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ::operator[]((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                              *)(this + 8),(ulong)__range4._4_4_);
      *ppEVar9 = pEVar7;
      ppEVar9 = std::
                vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ::operator[]((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                              *)(this + 8),(ulong)__range4._4_4_);
      pEVar3 = *ppEVar9;
      puVar10 = Entry_field_element<unsigned_int>::get_element
                          (&_pivotVal->super_Entry_field_element_option);
      Entry_field_element<unsigned_int>::set_element
                (&pEVar3->super_Entry_field_element_option,puVar10);
      std::
      _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
      ::operator++(&__end0);
      __range4._4_4_ = __range4._4_4_ + 1;
    }
    sVar13 = std::
             vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
             ::size((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                     *)(this + 8));
    *(int *)(this + 0x20) = (int)sVar13;
    this_local._7_1_ = true;
  }
  else {
    __range3._0_4_ = 0;
    __end0_1 = std::
               vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ::begin((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                        *)(this + 8));
    entry_1 = (Entry *)std::
                       vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                       ::end((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                              *)(this + 8));
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>_>
                          *)&entry_1);
      if (!bVar5) break;
      ppEVar8 = __gnu_cxx::
                __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>_>
                ::operator*(&__end0_1);
      this_00 = *(Zp_field_operators<unsigned_int,_void> **)(this + 0x28);
      puVar10 = Entry_field_element<unsigned_int>::get_element
                          (&(*ppEVar8)->super_Entry_field_element_option);
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (this_00,puVar10,*val);
      __gnu_cxx::
      __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>_>
      ::operator++(&__end0_1);
    }
    __end0_2 = std::
               set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
               ::begin(column);
    entry_2 = (Entry *)std::
                       set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
                       ::end(column);
    while( true ) {
      bVar5 = std::operator!=(&__end0_2,(_Self *)&entry_2);
      if (!bVar5) break;
      local_98 = std::
                 _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                 ::operator*(&__end0_2);
      *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
      pNVar2 = *(New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                 **)(this + 0x30);
      local_a4 = Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                 ::get_row_index(local_98);
      local_a0 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                 ::construct<unsigned_int>(pNVar2,&local_a4);
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
      ::push_back((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   *)(this + 8),&local_a0);
      ppEVar9 = std::
                vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ::back((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                        *)(this + 8));
      pEVar3 = *ppEVar9;
      puVar10 = Entry_field_element<unsigned_int>::get_element
                          (&local_98->super_Entry_field_element_option);
      Entry_field_element<unsigned_int>::set_element
                (&pEVar3->super_Entry_field_element_option,puVar10);
      iVar11 = std::
               vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ::begin((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                        *)(this + 8));
      iVar12 = std::
               vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ::end((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                      *)(this + 8));
      std::
      push_heap<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>>,Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>::EntryPointerComp>
                (iVar11._M_current,iVar12._M_current);
      std::
      _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
      ::operator++(&__end0_2);
    }
    iVar1 = *(int *)(this + 0x20);
    sVar13 = std::
             vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
             ::size((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                     *)(this + 8));
    if (sVar13 < (uint)(iVar1 << 1)) {
      Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
    EVar4 = (Element)__range3;
    EVar6 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_additive_identity();
    this_local._7_1_ = EVar4 == EVar6;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Heap_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      column_[i++]->set_element(entry.get_element());
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(0);

  for (Entry* entry : column_) {
    operators_->multiply_inplace(entry->get_element(), val);
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry->get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry->get_element());
    }
  }

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
    }
    column_.push_back(entryPool_->construct(entry.get_row_index()));
    column_.back()->set_element(entry.get_element());
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}